

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_trace_table.cc
# Opt level: O3

void __thiscall tcmalloc::StackTraceTable::AddTrace(StackTraceTable *this,StackTrace *t)

{
  LogItem b;
  LogItem c;
  LogItem d;
  pointer pEVar1;
  undefined4 uStack_4c;
  anon_union_8_4_e5b1a622_for_u_ aStack_48;
  undefined4 uStack_3c;
  anon_union_8_4_e5b1a622_for_u_ aStack_38;
  undefined4 uStack_2c;
  
  if (this->error_ == false) {
    pEVar1 = STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void>::allocate
                       ((STLPageHeapAllocator<tcmalloc::StackTraceTable::Entry,_void> *)
                        &this->field_0x10,1,(void *)0x0);
    if (pEVar1 == (pointer)0x0) {
      d._4_4_ = uStack_3c;
      d.tag_ = 4;
      c._4_4_ = uStack_4c;
      c.tag_ = 4;
      b._4_4_ = uStack_2c;
      b.tag_ = 2;
      b.u_.snum = 0x110;
      c.u_.str = aStack_48.str;
      d.u_.str = aStack_38.str;
      Log(kLog,
          "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/stack_trace_table.cc"
          ,0x57,(LogItem)(ZEXT816(0x1491c1) << 0x40),b,c,d);
      this->error_ = true;
    }
    else {
      memcpy(&pEVar1->trace,t,0x108);
      pEVar1->next = this->head_;
      this->head_ = pEVar1;
    }
  }
  return;
}

Assistant:

void StackTraceTable::AddTrace(const StackTrace& t) {
  if (error_) {
    return;
  }

  Entry* entry = allocator_.allocate(1);
  if (entry == nullptr) {
    Log(kLog, __FILE__, __LINE__,
        "tcmalloc: could not allocate bucket", sizeof(*entry));
    error_ = true;
  } else {
    entry->trace = t;
    entry->next = head_;
    head_ = entry;
  }
}